

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O2

bool WAsmJs::ShouldJitFunction(FunctionBody *body,uint interpretedCount)

{
  bool bVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  ScriptContext *pSVar4;
  
  uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
  LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)body);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,BackEndPhase,uVar2,LVar3);
  if (!bVar1) {
    uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
    LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)body);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FullJitPhase,uVar2,LVar3);
    if (((!bVar1) &&
        (pSVar4 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)body),
        (pSVar4->config).NoNative == false)) && (-1 < *(int *)&body->field_0x178)) {
      bVar1 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,ForceNativeFlag);
      if (bVar1) {
        return true;
      }
      if (DAT_01441e18 <= interpretedCount) {
        return true;
      }
      return DAT_01441e28 <= interpretedCount;
    }
  }
  return false;
}

Assistant:

bool ShouldJitFunction(Js::FunctionBody* body, uint interpretedCount)
    {
#if ENABLE_NATIVE_CODEGEN
        if (PHASE_OFF(Js::BackEndPhase, body) ||
            PHASE_OFF(Js::FullJitPhase, body) ||
            body->GetScriptContext()->GetConfig()->IsNoNative() ||
            body->GetIsAsmJsFullJitScheduled())
        {
            return false;
        }
#if ENABLE_OOP_NATIVE_CODEGEN
        if (JITManager::GetJITManager()->IsOOPJITEnabled() && !JITManager::GetJITManager()->IsConnected())
        {
            return false;
        }
#endif
        const bool forceNative = CONFIG_ISENABLED(Js::ForceNativeFlag);
        const uint minAsmJsInterpretRunCount = (uint)CONFIG_FLAG(MinAsmJsInterpreterRunCount);
        const uint maxAsmJsInterpretRunCount = (uint)CONFIG_FLAG(MaxAsmJsInterpreterRunCount);
        return forceNative || interpretedCount >= minAsmJsInterpretRunCount || interpretedCount >= maxAsmJsInterpretRunCount;
#else
        return false;
#endif
    }